

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Vector<unsigned_int,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Vector<unsigned_int,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_>
           *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  uint local_60 [2];
  Vector<unsigned_int,_2> local_58;
  Vector<unsigned_int,_2> result;
  Vector<double,_2> arg_2;
  Vector<double,_2> arg_1;
  functionPointer p_function;
  GLuint argument_1_stride;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  binary<tcu::Vector<unsigned_int,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_2>::Vector((Vector<double,_2> *)(arg_2.m_data + 1));
  tcu::Vector<double,_2>::Vector((Vector<double,_2> *)&result);
  tcu::Vector<unsigned_int,_2>::Vector(&local_58);
  unpack<tcu::Vector<double,_2>_>::get(argument_src,(Vector<double,_2> *)(arg_2.m_data + 1));
  unpack<tcu::Vector<double,_2>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar2),(Vector<double,_2> *)&result);
  (*pcVar1)(local_60,arg_2.m_data + 1,&result);
  local_58.m_data[0] = local_60[0];
  local_58.m_data[1] = local_60[1];
  pack<tcu::Vector<unsigned_int,_2>_>::set(result_dst,&local_58);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}